

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O1

void generate_const_func<unsigned_short>(void)

{
  size_t sVar1;
  char param_name [2];
  ushort local_3a;
  _Any_data local_38;
  code *pcStack_28;
  code *pcStack_20;
  
  local_3a = 0x76;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LIBDIVIDE_INLINE constexpr ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"libdivide_u16_t",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," get_divider_",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"u16",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"uint16_t",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  sVar1 = strlen((char *)&local_3a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_3a,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") {\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\treturn\n",8);
  local_38._8_8_ = 0;
  local_38._2_6_ = 0;
  local_38._0_2_ = local_3a;
  pcStack_20 = std::
               _Function_handler<void_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ridiculousfish[P]libdivide/test/fast_div_generator.cpp:107:22)>
               ::_M_invoke;
  pcStack_28 = std::
               _Function_handler<void_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ridiculousfish[P]libdivide/test/fast_div_generator.cpp:107:22)>
               ::_M_manager;
  generator<unsigned_short>((function<void_(unsigned_short)> *)&local_38);
  if (pcStack_28 != (code *)0x0) {
    (*pcStack_28)(&local_38,&local_38,__destroy_functor);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"libdivide_u16_t",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," { 0, 0 }; // Unreachable\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
  return;
}

Assistant:

void generate_const_func() {
    const char param_name[] = "v";
    std::cout << "LIBDIVIDE_INLINE constexpr " << struct_selector<_IntT>::get_name()
                << " get_divider_" << type_tag<_IntT>::get_tag() 
                << "(" << type_name<_IntT>::get_name() << " " << param_name << ") {\n"
                << "\treturn\n";
    generator<_IntT>([param_name](_IntT denom) { 
            std::cout << "\t";
            generate_ternary_primary<_IntT>(denom, param_name); 
            });
    std:: cout  << "\t" << struct_selector<_IntT>::get_name() << " { 0, 0 }; // Unreachable\n"
                << "}";
}